

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply ply_open(char *name,p_ply_error_cb error_cb,long idata,void *pdata)

{
  FILE *__stream;
  p_ply ply;
  FILE *fp;
  void *pdata_local;
  long idata_local;
  p_ply_error_cb error_cb_local;
  char *name_local;
  
  idata_local = (long)error_cb;
  if (error_cb == (p_ply_error_cb)0x0) {
    idata_local = (long)ply_error_cb;
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x16c,"p_ply ply_open(const char *, p_ply_error_cb, long, void *)");
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    (*(code *)idata_local)(0,"Unable to open file");
    name_local = (char *)0x0;
  }
  else {
    name_local = (char *)ply_open_from_file((FILE *)__stream,(p_ply_error_cb)idata_local,idata,pdata
                                           );
    if ((p_ply)name_local == (p_ply)0x0) {
      fclose(__stream);
    }
    else {
      ((p_ply)name_local)->own_fp = 1;
    }
  }
  return (p_ply)name_local;
}

Assistant:

p_ply ply_open(const char *name, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    FILE *fp;
    p_ply ply;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(name);
    fp = fopen(name, "rb");
    if (!fp) {
        error_cb(NULL, "Unable to open file");
        return NULL;
    }
    ply = ply_open_from_file(fp, error_cb, idata, pdata);
    if (ply) ply->own_fp = 1;
    else fclose(fp);
    return ply;
}